

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate1<float>::apply
          (QGate1<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  int iVar1;
  anon_class_24_5_e9a28bf2 f;
  SquareMatrix<float> local_58;
  anon_class_24_5_e9a28bf2 local_48;
  
  iVar1 = (*(this->super_QObject<float>)._vptr_QObject[3])();
  (*(this->super_QObject<float>)._vptr_QObject[7])(&local_58,this);
  lambda_QGate1<float>
            (&local_48,op,&local_58,
             (vector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_58.data_);
  apply2<qclab::qgates::lambda_QGate1<float>(qclab::Op,qclab::dense::SquareMatrix<float>,float*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,&local_48);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }